

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwizard.cpp
# Opt level: O0

void QWizard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  WizardStyle WVar3;
  TextFormat TVar4;
  int iVar5;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QWizardPrivate *in_stack_00000048;
  QWizard *_t;
  undefined8 in_stack_ffffffffffffff48;
  QFlagsStorage<QWizard::WizardOption> t;
  QWizard *in_stack_ffffffffffffff50;
  QWizard *this;
  QWizard *in_stack_ffffffffffffff58;
  QWizardPrivate *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  QFlagsStorage<QWizard::WizardOption> in_stack_ffffffffffffff74;
  QObject *in_stack_ffffffffffffff78;
  QWizardPrivate *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff98;
  int id;
  undefined8 in_stack_ffffffffffffffa8;
  QFlagsStorage<QWizard::WizardOption> options;
  
  t.i = (Int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  id = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  options.i = (Int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff60 = (QWizardPrivate *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff60) {
    case (QWizardPrivate *)0x0:
      currentIdChanged((QWizard *)0x7bd88f,t.i);
      break;
    case (QWizardPrivate *)0x1:
      helpRequested((QWizard *)0x7bd8a1);
      break;
    case (QWizardPrivate *)0x2:
      customButtonClicked((QWizard *)0x7bd8c1,t.i);
      break;
    case (QWizardPrivate *)0x3:
      pageAdded((QWizard *)0x7bd8e1,t.i);
      break;
    case (QWizardPrivate *)0x4:
      pageRemoved((QWizard *)0x7bd901,t.i);
      break;
    case (QWizardPrivate *)0x5:
      back((QWizard *)in_stack_ffffffffffffff60);
      break;
    case (QWizardPrivate *)0x6:
      next(in_stack_ffffffffffffff50);
      break;
    case (QWizardPrivate *)0x7:
      setCurrentId((QWizard *)CONCAT44(in_stack_ffffffffffffff74.i,in_stack_ffffffffffffff70),id);
      break;
    case (QWizardPrivate *)0x8:
      restart((QWizard *)in_stack_ffffffffffffff60);
      break;
    case (QWizardPrivate *)0x9:
      d_func((QWizard *)0x7bd963);
      QWizardPrivate::_q_emitCustomButtonClicked(in_stack_ffffffffffffff60);
      break;
    case (QWizardPrivate *)0xa:
      d_func((QWizard *)0x7bd97a);
      QWizardPrivate::_q_updateButtonStates(in_stack_00000048);
      break;
    case (QWizardPrivate *)0xb:
      d_func((QWizard *)0x7bd991);
      QWizardPrivate::_q_handleFieldObjectDestroyed
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  if (in_ESI == 5) {
    bVar2 = QtMocHelpers::indexOfMethod<void(QWizard::*)(int)>(in_RCX,(void **)currentIdChanged,0,0)
    ;
    if ((bVar2) ||
       (bVar2 = QtMocHelpers::indexOfMethod<void(QWizard::*)()>(in_RCX,(void **)helpRequested,0,1),
       bVar2)) goto switchD_007bdc26_default;
    options.i = 0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QWizard::*)(int)>
                      (in_RCX,(void **)customButtonClicked,0,2);
    if (bVar2) goto switchD_007bdc26_default;
    id = 0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QWizard::*)(int)>(in_RCX,(void **)pageAdded,0,3);
    if ((bVar2) ||
       (bVar2 = QtMocHelpers::indexOfMethod<void(QWizard::*)(int)>(in_RCX,(void **)pageRemoved,0,4),
       bVar2)) goto switchD_007bdc26_default;
  }
  if (in_ESI == 1) {
    this = *(QWizard **)in_RCX;
    in_stack_ffffffffffffff58 = (QWizard *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff58) {
    case (QWizard *)0x0:
      WVar3 = wizardStyle(in_stack_ffffffffffffff50);
      *(WizardStyle *)&(this->super_QDialog).super_QWidget = WVar3;
      break;
    case (QWizard *)0x1:
      in_stack_ffffffffffffff74.i = (Int)QWizard::options(this);
      QtMocHelpers::assignFlags<QFlags<QWizard::WizardOption>>
                ((void *)0x7bdb7b,(QFlags<QWizard::WizardOption>)t.i);
      in_stack_ffffffffffffff50 = this;
      break;
    case (QWizard *)0x2:
      TVar4 = titleFormat(in_stack_ffffffffffffff50);
      *(TextFormat *)&(this->super_QDialog).super_QWidget = TVar4;
      break;
    case (QWizard *)0x3:
      TVar4 = subTitleFormat(in_stack_ffffffffffffff50);
      *(TextFormat *)&(this->super_QDialog).super_QWidget = TVar4;
      break;
    case (QWizard *)0x4:
      iVar5 = startId(in_stack_ffffffffffffff50);
      *(int *)&(this->super_QDialog).super_QWidget = iVar5;
      break;
    case (QWizard *)0x5:
      iVar5 = currentId(in_stack_ffffffffffffff50);
      *(int *)&(this->super_QDialog).super_QWidget = iVar5;
    }
  }
  if (in_ESI == 2) {
    switch(in_EDX) {
    case 0:
      setWizardStyle((QWizard *)in_stack_ffffffffffffff60,
                     (WizardStyle)((ulong)in_stack_ffffffffffffff58 >> 0x20));
      break;
    case 1:
      setOptions((QWizard *)in_stack_ffffffffffffff60,(WizardOptions)options.i);
      break;
    case 2:
      setTitleFormat(in_stack_ffffffffffffff50,PlainText);
      break;
    case 3:
      setSubTitleFormat(in_stack_ffffffffffffff50,PlainText);
      break;
    case 4:
      setStartId(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      break;
    case 5:
      setCurrentId((QWizard *)CONCAT44(in_stack_ffffffffffffff74.i,in_stack_ffffffffffffff70),id);
    }
  }
switchD_007bdc26_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWizard *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentIdChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->helpRequested(); break;
        case 2: _t->customButtonClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->pageAdded((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->pageRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->back(); break;
        case 6: _t->next(); break;
        case 7: _t->setCurrentId((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->restart(); break;
        case 9: _t->d_func()->_q_emitCustomButtonClicked(); break;
        case 10: _t->d_func()->_q_updateButtonStates(); break;
        case 11: _t->d_func()->_q_handleFieldObjectDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::currentIdChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)()>(_a, &QWizard::helpRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::customButtonClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::pageAdded, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::pageRemoved, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<WizardStyle*>(_v) = _t->wizardStyle(); break;
        case 1: QtMocHelpers::assignFlags<WizardOptions>(_v, _t->options()); break;
        case 2: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->titleFormat(); break;
        case 3: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->subTitleFormat(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->startId(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->currentId(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWizardStyle(*reinterpret_cast<WizardStyle*>(_v)); break;
        case 1: _t->setOptions(*reinterpret_cast<WizardOptions*>(_v)); break;
        case 2: _t->setTitleFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 3: _t->setSubTitleFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 4: _t->setStartId(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setCurrentId(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}